

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

u32string * __thiscall QString::toStdU32String_abi_cxx11_(QString *this)

{
  long lVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  qsizetype length;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RSI;
  u32string *in_RDI;
  long in_FS_OFFSET;
  qsizetype len;
  u32string *u32str;
  size_type in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  allocator<char32_t> *in_stack_ffffffffffffff88;
  char16_t *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->field_2)._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&in_RDI->field_2 + 8) = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->_M_dataplus)._M_p = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->_M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  size((QString *)in_RSI);
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x3113e3);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            (in_RSI,(size_type)in_RDI,(char32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
             in_stack_ffffffffffffff88);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x311405);
  this_00 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
            data(in_stack_ffffffffffffff80);
  length = size((QString *)in_RSI);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::data
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             0x31142d);
  toUcs4_helper(in_stack_ffffffffffffff90,length,(char32_t *)this_00);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  resize(this_00,in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::u32string QString::toStdU32String() const
{
    std::u32string u32str(size(), char32_t(0));
    const qsizetype len = toUcs4_helper(reinterpret_cast<const char16_t *>(data()),
                                        size(), u32str.data());
    u32str.resize(len);
    return u32str;
}